

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O1

void __thiscall
omp_enumerate_container_iterator_types_Test::TestBody
          (omp_enumerate_container_iterator_types_Test *this)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  int local_28 [8];
  
  local_28[0] = 1;
  local_28[1] = 2;
  local_28[2] = 3;
  local_28[3] = 4;
  local_28[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(omp_enumerate, container_iterator_types) {
  std::vector v = {1, 2, 3, 4, 5};

  auto e_is_iterator_1 = std::is_same_v<typename std::vector<int>::iterator,
                                        typename decltype(omp::enumerate(
                                            v))::iterator::wrapped_iterator>;

  auto e_is_citerator_1 =
      std::is_same_v<typename std::vector<int>::const_iterator,
                     typename decltype(omp::enumerate(
                         std::as_const(v)))::iterator::wrapped_iterator>;

  auto e_is_iterator_2 =
      std::is_same_v<typename std::vector<int>::iterator,
                     typename decltype(omp::enumerate(
                         std::move(v)))::iterator::wrapped_iterator>;

  auto e_is_citerator_2 =
      std::is_same_v<typename std::vector<int>::const_iterator,
                     typename decltype(omp::enumerate(std::move(
                         std::as_const(v))))::iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_iterator_1 && e_is_citerator_1 && e_is_iterator_2 &&
              e_is_citerator_2);

  auto e_is_citerator =
      std::is_same_v<typename std::vector<int>::const_iterator,
                     typename decltype(omp::enumerate(
                         v))::const_iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_citerator);
}